

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
serial::Serial::readlines
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Serial *this,size_t size,string *eol)

{
  long lVar1;
  SerialImpl *pSVar2;
  pointer __s2;
  long lVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar4;
  _Alloc_hider _Var5;
  size_type __n;
  int iVar6;
  ssize_t sVar7;
  size_t __nbytes;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  bool bVar13;
  undefined8 uStack_90;
  Serial *local_88;
  long local_80;
  string *local_78;
  size_t local_70;
  SerialImpl *local_68;
  size_t local_60;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68 = this->pimpl_;
  uStack_90 = 0x1078bb;
  local_88 = this;
  SerialImpl::readLock(local_68);
  uVar9 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80 = -eol->_M_string_length;
  lVar3 = -(size + 0xf & 0xfffffffffffffff0);
  local_60 = (long)&local_88 + lVar3;
  sVar11 = 0;
  __nbytes = local_60;
  local_78 = eol;
  local_70 = size;
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  do {
    if (size <= uVar9) break;
    iVar6 = (int)local_60;
    pSVar2 = local_88->pimpl_;
    *(undefined8 *)((long)&uStack_90 + lVar3) = 0x10791a;
    sVar7 = SerialImpl::read(pSVar2,iVar6 + (int)uVar9,(void *)0x1,__nbytes);
    sVar8 = local_60;
    uVar9 = uVar9 + sVar7;
    if (sVar7 == 0) {
      if (sVar11 != uVar9) {
        lVar1 = local_60 + sVar11;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        lVar12 = local_60 + uVar9;
        *(undefined8 *)((long)&uStack_90 + lVar3) = 0x10799a;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,lVar1,lVar12);
        pvVar4 = local_58;
        *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1079a6;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar4,&local_50);
LAB_00107a58:
        _Var5._M_p = local_50._M_dataplus._M_p;
        __nbytes = sVar8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          uVar10 = local_50.field_2._M_allocated_capacity + 1;
          *(undefined8 *)((long)&uStack_90 + lVar3) = 0x107a71;
          operator_delete(_Var5._M_p,uVar10);
          __nbytes = sVar8;
        }
      }
LAB_00107a71:
      sVar8 = __nbytes;
      bVar13 = false;
    }
    else {
      lVar1 = local_60 + uVar9;
      lVar12 = lVar1 + local_80;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      *(undefined8 *)((long)&uStack_90 + lVar3) = 0x107946;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,lVar12,lVar1);
      __n = local_50._M_string_length;
      _Var5._M_p = local_50._M_dataplus._M_p;
      sVar8 = __nbytes;
      if (local_50._M_string_length == local_78->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar13 = true;
        }
        else {
          __s2 = (local_78->_M_dataplus)._M_p;
          *(undefined8 *)((long)&uStack_90 + lVar3) = 0x107969;
          iVar6 = bcmp(_Var5._M_p,__s2,__n);
          bVar13 = iVar6 == 0;
          sVar8 = __nbytes;
        }
      }
      else {
        bVar13 = false;
      }
      _Var5._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar10 = local_50.field_2._M_allocated_capacity + 1;
        *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1079cc;
        operator_delete(_Var5._M_p,uVar10);
      }
      size = local_70;
      if (bVar13) {
        lVar12 = sVar11 + local_60;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1079ef;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,lVar12,lVar1);
        pvVar4 = local_58;
        size = local_70;
        *(undefined8 *)((long)&uStack_90 + lVar3) = 0x1079ff;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar4,&local_50);
        _Var5._M_p = local_50._M_dataplus._M_p;
        sVar11 = uVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          uVar10 = local_50.field_2._M_allocated_capacity + 1;
          *(undefined8 *)((long)&uStack_90 + lVar3) = 0x107a18;
          operator_delete(_Var5._M_p,uVar10);
        }
      }
      bVar13 = true;
      if (uVar9 == size) {
        __nbytes = sVar8;
        if (sVar11 != uVar9) {
          lVar12 = local_60 + sVar11;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          *(undefined8 *)((long)&uStack_90 + lVar3) = 0x107a4c;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,lVar12,lVar1);
          pvVar4 = local_58;
          *(undefined8 *)((long)&uStack_90 + lVar3) = 0x107a58;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(pvVar4,&local_50);
          goto LAB_00107a58;
        }
        goto LAB_00107a71;
      }
    }
    __nbytes = sVar8;
  } while (bVar13);
  pSVar2 = local_68;
  *(undefined8 *)((long)&uStack_90 + lVar3) = 0x107a84;
  SerialImpl::readUnlock(pSVar2);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_58;
}

Assistant:

vector<string>
Serial::readlines (size_t size, string eol)
{
  ScopedReadLock lock(this->pimpl_);
  std::vector<std::string> lines;
  size_t eol_len = eol.length ();
  uint8_t *buffer_ = static_cast<uint8_t*>
    (alloca (size * sizeof (uint8_t)));
  size_t read_so_far = 0;
  size_t start_of_line = 0;
  while (read_so_far < size) {
    size_t bytes_read = this->read_ (buffer_+read_so_far, 1);
    read_so_far += bytes_read;
    if (bytes_read == 0) {
      if (start_of_line != read_so_far) {
        lines.push_back (
          string (reinterpret_cast<const char*> (buffer_ + start_of_line),
            read_so_far - start_of_line));
      }
      break; // Timeout occured on reading 1 byte
    }
    if (string (reinterpret_cast<const char*>
         (buffer_ + read_so_far - eol_len), eol_len) == eol) {
      // EOL found
      lines.push_back(
        string(reinterpret_cast<const char*> (buffer_ + start_of_line),
          read_so_far - start_of_line));
      start_of_line = read_so_far;
    }
    if (read_so_far == size) {
      if (start_of_line != read_so_far) {
        lines.push_back(
          string(reinterpret_cast<const char*> (buffer_ + start_of_line),
            read_so_far - start_of_line));
      }
      break; // Reached the maximum read length
    }
  }
  return lines;
}